

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avilib.cpp
# Opt level: O3

bool avilib::cancel(int32_t nom,int32_t denom,int32_t *out_nom,int32_t *out_denom)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = nom;
  iVar2 = denom;
  if (nom != 0 && denom != 0) {
    do {
      iVar1 = iVar2;
      if (iVar2 < iVar3) {
        iVar1 = iVar3;
      }
      iVar4 = iVar2;
      if (iVar3 < iVar2) {
        iVar4 = iVar3;
      }
      iVar3 = iVar4;
      iVar2 = iVar1 % iVar4;
    } while (iVar1 % iVar4 != 0);
    *out_nom = nom / iVar4;
    *out_denom = denom / iVar4;
  }
  return nom != 0 && denom != 0;
}

Assistant:

bool avilib::cancel( int32_t nom, int32_t denom, int32_t &out_nom, int32_t &out_denom )
{
	if( !denom || !nom ) return false;
	int32_t _gcd = gcd( nom, denom );

	if( _gcd ) {
		out_nom = nom / _gcd;
		out_denom = denom / _gcd;
		return true;
	}

	return false;
}